

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O2

void glslang::OutputConstantUnion
               (TInfoSink *out,TIntermTyped *node,TConstUnionArray *constUnion,EExtraOutput extra,
               int depth)

{
  TInfoSinkBase *this;
  TBasicType TVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer pTVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  longlong lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  double dVar10;
  bool bVar11;
  char buf [300];
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  uVar3 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar2));
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  this = &out->debug;
  uVar7 = 0;
  do {
    if (uVar7 == uVar3) {
      return;
    }
    OutputTreeText(out,&node->super_TIntermNode,depth);
    pTVar4 = (constUnion->unionArray->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    TVar1 = pTVar4[uVar7].type;
    if (0x1a < TVar1 - EbtFloat) {
switchD_002fb466_caseD_d:
      iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      TInfoSinkBase::message
                (&out->info,EPrefixInternalError,"Unknown constant",
                 (TSourceLoc *)CONCAT44(extraout_var_00,iVar2),false,false);
      goto LAB_002fb794;
    }
    pTVar4 = pTVar4 + uVar7;
    switch(TVar1) {
    case EbtFloat:
    case EbtDouble:
    case EbtFloat16:
      dVar10 = (pTVar4->field_0).dConst;
      if (ABS(dVar10) == INFINITY) {
        if (0.0 <= dVar10) {
          pcVar8 = "+1.#INF";
        }
        else {
          pcVar8 = "-1.#INF";
        }
        goto LAB_002fb780;
      }
      if (NAN(dVar10)) {
        pcVar8 = "1.#IND";
        goto LAB_002fb780;
      }
      pcVar8 = "%f";
      if (1000000000000.0 < ABS(dVar10)) {
        pcVar8 = "%-.13e";
      }
      if (ABS(dVar10) < 1e-05) {
        pcVar8 = "%-.13e";
      }
      if (dVar10 == (double)(tSamplePos)0x0) {
        pcVar8 = "%f";
      }
      iVar2 = snprintf(buf,0x154,pcVar8);
      if (0x153 < iVar2) {
        __assert_fail("len < maxSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/intermOut.cpp"
                      ,0x453,
                      "void glslang::OutputDouble(TInfoSink &, double, TOutputTraverser::EExtraOutput)"
                     );
      }
      if ((((5 < iVar2) && (buf[iVar2 - 5] == 'e')) &&
          ((buf[iVar2 - 4] == '-' || (buf[iVar2 - 4] == '+')))) && (buf[iVar2 - 3U] == '0')) {
        buf[iVar2 - 3U] = buf[iVar2 - 2U];
        buf[iVar2 - 2U] = buf[iVar2 - 1U];
        buf[iVar2 - 1U] = '\0';
      }
      TInfoSinkBase::append(this,buf);
      if (extra == BinaryDoubleOutput) {
        TInfoSinkBase::append(this," : ");
        lVar9 = 0x40;
        while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
          pcVar8 = "1";
          if (-1 < (long)dVar10) {
            pcVar8 = "0";
          }
          TInfoSinkBase::append(this,pcVar8);
          dVar10 = (double)((long)dVar10 * 2 + 1);
        }
      }
      goto LAB_002fb785;
    case EbtInt8:
      uVar5 = (ulong)(uint)(int)(pTVar4->field_0).i8Const;
      pcVar8 = "%d (%s)";
      break;
    case EbtUint8:
      uVar5 = (ulong)(pTVar4->field_0).u8Const;
      pcVar8 = "%u (%s)";
      break;
    case EbtInt16:
      uVar5 = (ulong)(uint)(int)(pTVar4->field_0).i16Const;
      pcVar8 = "%d (%s)";
      break;
    case EbtUint16:
      uVar5 = (ulong)(pTVar4->field_0).u16Const;
      pcVar8 = "%u (%s)";
      break;
    case EbtInt:
      uVar5 = (ulong)(pTVar4->field_0).uConst;
      pcVar8 = "%d (%s)";
      break;
    case EbtUint:
      uVar5 = (ulong)(pTVar4->field_0).uConst;
      pcVar8 = "%u (%s)";
      break;
    case EbtInt64:
      lVar6 = (pTVar4->field_0).i64Const;
      pcVar8 = "%lld (%s)";
      goto LAB_002fb74d;
    case EbtUint64:
      lVar6 = (pTVar4->field_0).i64Const;
      pcVar8 = "%llu (%s)";
LAB_002fb74d:
      snprintf(buf,300,pcVar8,lVar6);
      goto LAB_002fb77a;
    case EbtBool:
      pcVar8 = "false";
      if ((pTVar4->field_0).i8Const != '\0') {
        pcVar8 = "true";
      }
      TInfoSinkBase::append(this,pcVar8);
      TInfoSinkBase::append(this," (");
      TInfoSinkBase::append(this,"const bool");
      pcVar8 = ")";
      goto LAB_002fb780;
    default:
      goto switchD_002fb466_caseD_d;
    case EbtString:
      TInfoSinkBase::append(this,"\"");
      TInfoSinkBase::append
                (this,(((constUnion->unionArray->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7].field_0.sConst)->
                      _M_dataplus)._M_p);
      pcVar8 = "\"\n";
      goto LAB_002fb78f;
    }
    snprintf(buf,300,pcVar8,uVar5);
LAB_002fb77a:
    pcVar8 = buf;
LAB_002fb780:
    TInfoSinkBase::append(this,pcVar8);
LAB_002fb785:
    pcVar8 = "\n";
LAB_002fb78f:
    TInfoSinkBase::append(this,pcVar8);
LAB_002fb794:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void OutputConstantUnion(TInfoSink& out, const TIntermTyped* node, const TConstUnionArray& constUnion,
    TOutputTraverser::EExtraOutput extra, int depth)
{
    int size = node->getType().computeNumComponents();

    for (int i = 0; i < size; i++) {
        OutputTreeText(out, node, depth);
        switch (constUnion[i].getType()) {
        case EbtBool:
            if (constUnion[i].getBConst())
                out.debug << "true";
            else
                out.debug << "false";

            out.debug << " (" << "const bool" << ")";

            out.debug << "\n";
            break;
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            OutputDouble(out, constUnion[i].getDConst(), extra);
            out.debug << "\n";
            break;
        case EbtInt8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI8Const(), "const int8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU8Const(), "const uint8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI16Const(), "const int16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU16Const(), "const uint16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getIConst(), "const int");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getUConst(), "const uint");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%lld (%s)", constUnion[i].getI64Const(), "const int64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%llu (%s)", constUnion[i].getU64Const(), "const uint64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtString:
            out.debug << "\"" << constUnion[i].getSConst()->c_str() << "\"\n";
            break;
        default:
            out.info.message(EPrefixInternalError, "Unknown constant", node->getLoc());
            break;
        }
    }
}